

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O0

int64_t sparse_file_len(sparse_file *s,bool sparse,bool crc)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  output_file *poVar4;
  byte bVar5;
  byte in_DL;
  byte in_SIL;
  int unaff_retaddr;
  int in_stack_00000008;
  output_file *out;
  int64_t count;
  int chunks;
  int ret;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sparse_file *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  int64_t local_8;
  
  bVar5 = in_SIL & 1;
  bVar1 = in_DL & 1;
  uVar2 = sparse_count_chunks(in_stack_ffffffffffffffd0);
  local_8 = 0;
  poVar4 = output_file_open_callback
                     ((_func_int_void_ptr_void_ptr_size_t *)
                      CONCAT17(bVar5,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,
                                                             in_stack_ffffffffffffffe8))),
                      (void *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),0,
                      (int64_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                      in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008);
  if (poVar4 == (output_file *)0x0) {
    local_8 = -1;
  }
  else {
    iVar3 = write_all_blocks((sparse_file *)
                             CONCAT17(bVar5,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,
                                                                    in_stack_ffffffffffffffe8))),
                             (output_file *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    output_file_close((output_file *)0x10725b);
    if (iVar3 < 0) {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

int64_t sparse_file_len(struct sparse_file* s, bool sparse, bool crc) {
  int ret;
  int chunks = sparse_count_chunks(s);
  int64_t count = 0;
  struct output_file* out;

  out = output_file_open_callback(out_counter_write, &count, s->block_size, s->len, false, sparse,
                                  chunks, crc);
  if (!out) {
    return -1;
  }

  ret = write_all_blocks(s, out);

  output_file_close(out);

  if (ret < 0) {
    return -1;
  }

  return count;
}